

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::ConcatenationExpression::evalLValueImpl
          (ConcatenationExpression *this,EvalContext *context)

{
  bool bVar1;
  __extent_storage<18446744073709551615UL> this_00;
  ConcatenationExpression *in_RSI;
  LValue *in_RDI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  LValue lval;
  Expression *operand;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> lvals;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *this_01;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_68;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::vector
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)0xf4a946);
  local_40 = operands(in_RSI);
  this_00 = local_40._M_extent._M_extent_value;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xf4a983);
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
             this_00._M_extent_value,(size_type)in_RSI);
  sVar2 = operands(in_RSI);
  local_58 = &local_68;
  local_68 = sVar2;
  local_70._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffda8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             sVar2._M_extent._M_extent_value._M_extent_value);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffda8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(&local_70);
    Expression::evalLValue
              ((Expression *)sVar2._M_extent._M_extent_value._M_extent_value,
               (EvalContext *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    bVar1 = LValue::operator_cast_to_bool((LValue *)0xf4aa5d);
    in_stack_fffffffffffffdb7 = bVar1;
    if (bVar1) {
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
      emplace_back<slang::ast::LValue>
                ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)sVar2._M_ptr,
                 (LValue *)sVar2._M_extent._M_extent_value._M_extent_value);
    }
    else {
      LValue::LValue((LValue *)CONCAT17(bVar1,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8);
    }
    LValue::~LValue((LValue *)0xf4aae6);
    this_01 = (vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)sVar2._M_ptr;
    if (!bVar1) goto LAB_00f4ab22;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_70);
  }
  LValue::LValue((LValue *)this_00._M_extent_value,
                 (vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)in_RSI,
                 (Kind)((ulong)in_RDI >> 0x20));
  this_01 = (vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)sVar2._M_ptr;
LAB_00f4ab22:
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector(this_01);
  return in_RDI;
}

Assistant:

LValue ConcatenationExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(operands().size());
    for (auto operand : operands()) {
        LValue lval = operand->evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    return LValue(std::move(lvals), LValue::Concat::Packed);
}